

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_torn_write.cpp
# Opt level: O1

idx_t GetWALFileSize(FileSystem *fs,string *path)

{
  FileHandle *in_RAX;
  type pFVar1;
  idx_t iVar2;
  pointer *__ptr;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> handle;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  (**(code **)(*(long *)fs + 0x10))(&local_18,fs,path,1,0x100,0);
  pFVar1 = duckdb::unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
           operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                      *)&local_18);
  iVar2 = (**(code **)(*(long *)fs + 0x40))(fs,pFVar1);
  if (local_18._M_head_impl != (FileHandle *)0x0) {
    (**(code **)(*(long *)local_18._M_head_impl + 8))();
  }
  return iVar2;
}

Assistant:

static idx_t GetWALFileSize(FileSystem &fs, const string &path) {
	auto handle = fs.OpenFile(path, FileFlags::FILE_FLAGS_READ);
	return fs.GetFileSize(*handle);
}